

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::Length(VirtualMachine *this)

{
  element_type *peVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  undefined8 uVar3;
  Variable VVar4;
  string local_40;
  
  VVar4 = popOpStack(this);
  switch(VVar4.type) {
  case Undefined:
  case Integer:
  case Boolean:
  case Float:
  case Function:
    uVar3 = 0;
    aVar2.integerValue = 0;
    goto LAB_00116edf;
  case String:
    aVar2 = (anon_union_8_6_52c89740_for_Variable_1)
            ((VVar4.field_1.objectValue)->properties)._M_h._M_bucket_count;
    break;
  case Object:
    aVar2 = (anon_union_8_6_52c89740_for_Variable_1)
            ((VVar4.field_1.objectValue)->properties)._M_h._M_element_count;
    break;
  default:
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unknown varible type at variableEquals","");
    panic(this,&local_40);
  }
  uVar3 = 1;
LAB_00116edf:
  VVar4.field_1.integerValue = aVar2.integerValue;
  VVar4._0_8_ = uVar3;
  pushOpStack(this,VVar4);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Length() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushUndefined();
      break;
    }
    case VariableType::Float: {
      this->pushUndefined();
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushInteger(top.objectValue->properties.size());
      break;
    }
    case VariableType::String: {
      this->pushInteger(top.stringValue->size());
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}